

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::tokenize_text
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets)

{
  CharInfo *this_00;
  pointer pCVar1;
  bool bVar2;
  Options *pOVar3;
  Options *pOVar4;
  Tokenizer *pTVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  Mode MVar10;
  Mode MVar11;
  Casing CVar12;
  mapped_type *pmVar13;
  const_iterator cVar14;
  int iVar15;
  ulong uVar16;
  char *__s;
  ulong end;
  ulong uVar17;
  CharInfo *c;
  pointer pCVar18;
  CharType CVar19;
  Tokenizer *pTVar20;
  int alphabet;
  int local_134;
  Tokenizer *local_130;
  allocator<char> local_121;
  size_t local_120;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_118;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  TokensBuilder builder;
  vector<int,_std::allocator<int>_> scripts;
  key_type local_50;
  
  local_130 = this;
  local_118 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)alphabets;
  unicode::get_characters_info(&chars,text);
  scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&scripts,(long)chars.
                            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)chars.
                            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  pCVar1 = chars.
           super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar15 = -1;
  for (pCVar18 = chars.
                 super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar18 != pCVar1; pCVar18 = pCVar18 + 1
      ) {
    iVar9 = unicode::get_script(pCVar18->value,iVar15);
    builder._tokens =
         (vector<onmt::Token,_std::allocator<onmt::Token>_> *)CONCAT44(builder._tokens._4_4_,iVar9);
    std::vector<int,std::allocator<int>>::emplace_back<int_const&>
              ((vector<int,std::allocator<int>> *)&scripts,(int *)&builder);
    if ((int)builder._tokens != -1) {
      iVar15 = (int)builder._tokens;
    }
  }
  builder._current_token.surface._M_dataplus._M_p = (pointer)&builder._current_token.surface.field_2
  ;
  builder._no_substitution = (local_130->_options).no_substitution;
  builder._current_token.surface._M_string_length = 0;
  uVar17 = 0;
  builder._current_token.surface.field_2._M_local_buf[0] = '\0';
  builder._current_token.type = Word;
  builder._current_token.casing = None;
  builder._current_token.join_left = false;
  builder._current_token.join_right = false;
  builder._current_token.spacer = false;
  builder._current_token.preserve = false;
  builder._current_feature._M_dataplus._M_p = (pointer)&builder._current_feature.field_2;
  builder._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder._current_token.features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder._current_length = 0;
  builder._current_feature._M_string_length = 0;
  builder._current_feature.field_2._M_local_buf[0] = '\0';
  pOVar3 = &local_130->_options;
  pOVar4 = &local_130->_options;
  iVar15 = 2;
  local_134 = -1;
  pTVar20 = local_130;
  builder._tokens = annotated_tokens;
  do {
    pTVar5 = local_130;
    uVar16 = (long)chars.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)chars.
                   super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar16 <= uVar17) {
      TokensBuilder::~TokensBuilder(&builder);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&scripts.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
      ~_Vector_base(&chars.
                     super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                   );
      return;
    }
    iVar9 = chars.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar17].value;
    if (iVar9 == 0xfeff || iVar9 < 0x20) goto LAB_001f7476;
    this_00 = chars.
              super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar17;
    local_120 = uVar17 + 1;
    pCVar1 = chars.
             super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar17;
    for (end = local_120; pCVar18 = pCVar1 + 1, end < uVar16; end = end + 1) {
      if ((pCVar1[1].char_type != Mark) ||
         ((((pTVar20->_options).allow_isolated_marks & 1U) != 0 &&
          ((chars.
            super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar17].char_type == Separator ||
           ((((pTVar20->_options).segment_alphabet_change & 1U) != 0 &&
            (scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[end] !=
             scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar17])))))))) goto LAB_001f708f;
      pCVar1 = pCVar18;
    }
    pCVar18 = (pointer)0x0;
    end = uVar16;
LAB_001f708f:
    if (iVar15 == 4) {
      if (iVar9 != 0xff60) {
        if (this_00->char_type != Separator) goto LAB_001f71e3;
        TokensBuilder::escape_append(&builder,this_00);
        iVar15 = 4;
        goto LAB_001f7476;
      }
      TokensBuilder::append(&builder,this_00);
      if ((pTVar20->_options).preserve_placeholders == true) {
        builder._current_token.preserve = true;
      }
      iVar9 = -2;
LAB_001f70b9:
      iVar15 = 0;
      local_134 = iVar9;
    }
    else if (iVar9 == 0xff5f) {
      if (iVar15 != 2) {
        TokensBuilder::segment(&builder);
        if ((iVar15 == 1) || (iVar15 == 0 && local_134 != -2)) {
          builder._current_token.join_left = true;
        }
        else {
          ((builder._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
          .super__Vector_impl_data._M_finish[-1].join_right = true;
        }
      }
LAB_001f71e3:
      TokensBuilder::append(&builder,this_00);
      iVar15 = 4;
    }
    else {
      CVar19 = this_00->char_type;
      if (CVar19 != Separator) {
        if ((local_130->_options).support_prior_joiners == true) {
          bVar6 = unicode::CharInfo::operator==(this_00,&pOVar3->joiner);
          pTVar20 = local_130;
          if (bVar6) {
            if (iVar15 == 2) {
              builder._current_token.join_left = true;
            }
            else {
              if (iVar15 == 3) {
                ((builder._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
                goto LAB_001f7245;
              }
              TokensBuilder::segment(&builder);
              ((builder._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
            }
            goto LAB_001f742e;
          }
          CVar19 = this_00->char_type;
        }
        alphabet = -1;
        if (CVar19 == Number) {
          alphabet = -3;
          __s = "Numeric";
          if (local_118 ==
              (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)0x0) {
            MVar11 = (local_130->_options).mode;
            if (MVar11 != Conservative) {
LAB_001f734d:
              pTVar20 = local_130;
              if (MVar11 == Char || CVar19 != Number) {
                if (iVar15 != 2) {
                  TokensBuilder::segment(&builder);
                  builder._current_token.join_left = true;
                  if (((pTVar20->_options).preserve_segmented_tokens == true) &&
                     (this_00->char_type == Mark)) {
                    builder._current_token.preserve = true;
                  }
                }
                TokensBuilder::safe_append(&builder,this_00);
                if (end != local_120) {
                  TokensBuilder::append(&builder,&chars,local_120,end);
                  uVar17 = end - 1;
                }
                TokensBuilder::segment(&builder);
                iVar15 = 3;
                goto LAB_001f7476;
              }
              bVar7 = iVar15 == 1 & (local_130->_options).segment_numbers;
              if (iVar15 == 0 || bVar7 != 0) {
                if ((bVar7 & (local_130->_options).preserve_segmented_tokens) == 1) {
                  builder._current_token.preserve = true;
                }
                TokensBuilder::segment(&builder);
                if ((iVar15 == 0) && (local_134 != -2)) {
                  builder._current_token.join_left = true;
                }
                else {
LAB_001f7437:
                  ((builder._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)
                  ._M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
                }
              }
              else if (iVar15 == 3) goto LAB_001f7437;
              TokensBuilder::safe_append(&builder,this_00);
              if (end != local_120) {
                TokensBuilder::append(&builder,&chars,local_120,end);
                uVar17 = end - 1;
              }
              iVar15 = 1;
              goto LAB_001f7476;
            }
          }
          else {
LAB_001f72b9:
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_121);
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_118,&local_50);
            *pmVar13 = *pmVar13 + 1;
            std::__cxx11::string::~string((string *)&local_50);
            MVar11 = (local_130->_options).mode;
            if (MVar11 != Conservative) goto LAB_001f7328;
            if (CVar19 != Number) goto LAB_001f7310;
          }
LAB_001f74b2:
          alphabet = -3;
        }
        else {
          if (CVar19 == Letter) {
            alphabet = scripts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17];
          }
          if (local_118 !=
              (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)0x0) {
            __s = "Other";
            if ((CVar19 == Letter) && (__s = "Other", -1 < alphabet)) {
              __s = unicode::get_script_name(alphabet);
            }
            goto LAB_001f72b9;
          }
          MVar11 = (local_130->_options).mode;
          if (MVar11 == Conservative) {
LAB_001f7310:
            iVar9 = this_00->value;
            if (iVar9 == 0x5f) goto LAB_001f74b2;
            MVar10 = Conservative;
            MVar11 = Conservative;
            if (iVar15 == 0) {
              if (iVar9 == 0x2d) goto LAB_001f74b2;
              MVar11 = MVar10;
              if (iVar9 == 0x2e) {
                if (pCVar18 != (pointer)0x0) {
LAB_001f74a4:
                  if ((pCVar18->char_type & ~Number) == Letter) goto LAB_001f74b2;
                }
              }
              else if ((pCVar18 != (pointer)0x0) && (iVar9 == 0x2c)) goto LAB_001f74a4;
            }
          }
LAB_001f7328:
          if (MVar11 == Char || CVar19 != Letter) goto LAB_001f734d;
        }
        CVar12 = update_casing(builder._current_token.casing,this_00->case_type,
                               builder._current_length);
        pTVar20 = local_130;
        iVar9 = local_134;
        if (iVar15 == 1) {
          bVar6 = false;
LAB_001f7514:
          bVar2 = false;
          cVar8 = '\0';
LAB_001f7516:
          builder._current_token.join_right = true;
          if (((pTVar20->_options).preserve_segmented_tokens == true) &&
             ((bVar2 || bVar6 || (cVar8 != '\0')))) {
            builder._current_token.preserve = true;
          }
          TokensBuilder::segment(&builder);
          CVar12 = update_casing(builder._current_token.casing,this_00->case_type,0);
          builder._current_token.casing = CVar12;
        }
        else {
          if (iVar15 == 0) {
            if ((-1 < alphabet && local_134 == alphabet) &&
               (cVar14 = std::
                         _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&(pOVar4->segment_alphabet_codes)._M_h,&alphabet),
               cVar14.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0)) {
              bVar6 = true;
              goto LAB_001f7514;
            }
            if (iVar9 == alphabet) {
              cVar8 = '\0';
            }
            else {
              cVar8 = (pTVar20->_options).segment_alphabet_change;
              bVar2 = false;
              if ((bool)cVar8 != false) {
                bVar6 = false;
                goto LAB_001f7516;
              }
            }
            bVar2 = false;
            bVar6 = false;
            if (iVar9 != -2) {
              if ((CVar12 != Mixed) || ((pTVar20->_options).segment_case == false)) {
                builder._current_token.casing = CVar12;
                goto LAB_001f75af;
              }
              bVar6 = false;
              bVar2 = true;
            }
            goto LAB_001f7516;
          }
          builder._current_token.casing = CVar12;
          if ((iVar15 == 3) && (builder._current_token.surface._M_string_length == 0)) {
            ((builder._tokens)->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1].join_right = true;
          }
        }
LAB_001f75af:
        TokensBuilder::safe_append(&builder,this_00);
        iVar9 = alphabet;
        if (end != local_120) {
          TokensBuilder::append(&builder,&chars,local_120,end);
          uVar17 = end - 1;
          iVar9 = alphabet;
        }
        goto LAB_001f70b9;
      }
      pTVar20 = pTVar5;
      if (end == local_120) {
        if (iVar15 != 2) {
          TokensBuilder::segment(&builder);
        }
        if (((pTVar5->_options).with_separators == true) &&
           ((TokensBuilder::append(&builder,this_00), pCVar18 == (pointer)0x0 ||
            (pCVar18->char_type != Separator)))) {
          TokensBuilder::segment(&builder);
          iVar15 = 2;
        }
        else {
LAB_001f742e:
          iVar15 = 2;
        }
      }
      else {
        if (iVar15 != 2) {
          TokensBuilder::segment(&builder);
          builder._current_token.join_left = true;
        }
        TokensBuilder::escape_append(&builder,this_00);
        TokensBuilder::append(&builder,&chars,local_120,end);
        TokensBuilder::segment(&builder);
        uVar17 = end - 1;
LAB_001f7245:
        iVar15 = 3;
      }
    }
LAB_001f7476:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void Tokenizer::tokenize_text(const std::string& text,
                                std::vector<Token>& annotated_tokens,
                                std::unordered_map<std::string, size_t>* alphabets) const
  {
    // TODO: this method has grown big and is hard to follow. It should be refactored into
    // smaller pieces to clarify its logic.

    const auto chars = unicode::get_characters_info(text);

    std::vector<int> scripts;

    {
      scripts.reserve(chars.size());
      int previous_script = -1;
      for (const auto& c : chars) {
        const int script = unicode::get_script(c.value, previous_script);
        scripts.emplace_back(script);
        if (script != -1)
          previous_script = script;
      }
    }

    TokensBuilder builder(_options, annotated_tokens);
    State state = State::Space;
    int prev_alphabet = -1;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      const auto& c = chars[i];
      const unicode::code_point_t v = c.value;
      if (v < 32 || v == 0xFEFF)  // skip special characters and BOM
        continue;

      const size_t next_index = get_next_main_char(chars, scripts, i, _options);
      const auto* next_c = next_index < chars.size() ? &chars[next_index] : nullptr;
      const bool has_combining_marks = (next_index != i + 1);

      if (state == State::Placeholder)
      {
        if (v == ph_marker_close_cp)
        {
          builder.append(c);
          if (_options.preserve_placeholders)
            builder.current().preserve = true;
          prev_alphabet = placeholder_alphabet;
          state = State::Letter;
        }
        else if (c.char_type == unicode::CharType::Separator)
          builder.escape_append(c);
        else
          builder.append(c);
      }

      else if (v == ph_marker_open_cp)
      {
        if (state != State::Space)
        {
          builder.segment();
          if ((state == State::Letter && prev_alphabet != placeholder_alphabet)
              || state == State::Number)
            builder.current().join_left = true;
          else
            builder.previous().join_right = true;
        }
        builder.append(c);
        state = State::Placeholder;
      }

      else if (c.char_type == unicode::CharType::Separator)
      {
        if (has_combining_marks)
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
          }

          builder.escape_append(c);
          builder.append(chars, i + 1, next_index);
          builder.segment();
          i = next_index - 1;
          state = State::Other;
        }
        else
        {
          if (state != State::Space)
            builder.segment();

          if (_options.with_separators)
          {
            builder.append(c);
            if (!next_c || next_c->char_type != unicode::CharType::Separator)
              builder.segment();
          }

          state = State::Space;
        }
      }

      else if (_options.support_prior_joiners && c == _options.joiner)
      {
        if (state == State::Other)
          builder.previous().join_right = true;
        else if (state == State::Space)
          builder.current().join_left = true;
        else
        {
          builder.segment();
          builder.previous().join_right = true;
          state = State::Space;
        }
      }

      else
      {
        bool is_letter = c.char_type == unicode::CharType::Letter;
        bool is_number = c.char_type == unicode::CharType::Number;

        int alphabet = -1;
        if (is_number)
          alphabet = number_alphabet;
        else if (is_letter)
          alphabet = scripts[i];

        if (alphabets != nullptr)
        {
          const char* alphabet_name = "Other";
          if (is_number)
            alphabet_name = "Numeric";
          else if (is_letter && alphabet >= 0)
            alphabet_name = unicode::get_script_name(alphabet);
          (*alphabets)[alphabet_name]++;
        }

        if (_options.mode == Mode::Conservative)
        {
          if (is_number
              || (c == '_')
              || (state == State::Letter && c == '-')
              || (state == State::Letter
                  && (c == '.' || c == ',')
                  && next_c
                  && (next_c->char_type == unicode::CharType::Number
                      || next_c->char_type == unicode::CharType::Letter)))
          {
            is_letter = true;
            alphabet = number_alphabet;
          }
        }

        if (is_letter && _options.mode != Mode::Char)
        {
          const Casing new_casing = update_casing(builder.current().casing,
                                                  c.case_type,
                                                  builder.current_length());

          bool segment_case = false;
          bool segment_alphabet = false;
          bool segment_alphabet_change = false;
          if (state == State::Number
              || (state == State::Letter &&
                  ((segment_alphabet = (prev_alphabet == alphabet
                                        && alphabet >= 0
                                        && (_options.segment_alphabet_codes.find(alphabet)
                                            != _options.segment_alphabet_codes.end())))
                   || (segment_alphabet_change = (prev_alphabet != alphabet
                                                  && _options.segment_alphabet_change))
                   || (prev_alphabet == placeholder_alphabet)
                   || (_options.segment_case
                       && (segment_case = (new_casing == Casing::Mixed))))))
          {
            builder.current().join_right = true;
            if (_options.preserve_segmented_tokens
                && (segment_case || segment_alphabet || segment_alphabet_change))
              builder.current().preserve = true;
            builder.segment();
            builder.current().casing = update_casing(builder.current().casing, c.case_type, 0);
          }
          else
          {
            builder.current().casing = new_casing;
            if (state == State::Other && builder.is_new_token())
              builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Letter;
          prev_alphabet = alphabet;
        }
        else if (is_number && _options.mode != Mode::Char)
        {
          const bool segment_number = (_options.segment_numbers && state == State::Number);
          if (state == State::Letter || segment_number)
          {
            if (_options.preserve_segmented_tokens && segment_number)
              builder.current().preserve = true;
            builder.segment();
            if (state != State::Letter || prev_alphabet == placeholder_alphabet)
              builder.previous().join_right = true;
            else
              builder.current().join_left = true;
          }
          else if (state == State::Other)
          {
            builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Number;
        }
        else
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
            if (_options.preserve_segmented_tokens && c.char_type == unicode::CharType::Mark)
              builder.current().preserve = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          builder.segment();
          state = State::Other;
        }
      }
    }
  }